

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damerau_levenshtein_distance.cc
# Opt level: O2

uint8_t absl::strings_internal::CappedDamerauLevenshteinDistance
                  (string_view s1,string_view s2,uint8_t cutoff)

{
  char cVar1;
  uchar uVar2;
  array<unsigned_char,_102UL> *paVar3;
  ulong uVar4;
  ulong uVar5;
  array<unsigned_char,_102UL> *paVar6;
  char *pcVar7;
  long lVar8;
  undefined7 in_register_00000081;
  size_t j;
  ulong uVar9;
  size_t i;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  initializer_list<unsigned_char> __l;
  byte local_2905;
  char local_2904;
  char local_2903;
  char local_2902;
  byte local_2901;
  char *local_2900;
  ulong local_28f8;
  ulong local_28f0;
  ulong local_28e8;
  ulong local_28e0;
  byte local_28d5;
  array<std::array<unsigned_char,_102UL>,_102UL> d;
  
  local_28f8 = s2._M_len;
  pcVar7 = s1._M_str;
  uVar9 = s1._M_len;
  uVar10 = 100;
  if (cutoff < 100) {
    uVar10 = CONCAT71(in_register_00000081,cutoff);
  }
  cVar1 = (char)(uVar10 & 0xffffffff);
  bVar11 = cVar1 + 1;
  if (local_28f8 < uVar9) {
    local_2900 = pcVar7;
    local_28e0 = local_28f8;
    local_28f8 = uVar9;
    pcVar7 = s2._M_str;
  }
  else {
    local_2900 = s2._M_str;
    local_28e0 = uVar9;
  }
  local_28f0 = uVar10 & 0xff;
  bVar12 = bVar11;
  if ((local_28f8 < 0x65 && local_28f8 <= local_28f0 + local_28e0) &&
     (bVar12 = (byte)local_28f8, local_28e0 != 0)) {
    for (lVar8 = 0; local_28f0 + 1 != lVar8; lVar8 = lVar8 + 1) {
      d._M_elems[0]._M_elems[lVar8] = (uchar)lVar8;
    }
    d._M_elems[0]._M_elems[(uVar10 & 0xffffffff) + 1] = bVar11;
    local_28e8 = (ulong)(byte)(((char)local_28e0 - bVar12) + cVar1);
    paVar6 = d._M_elems;
    for (uVar10 = 1; uVar10 <= local_28e0; uVar10 = uVar10 + 1) {
      paVar3 = d._M_elems + uVar10;
      uVar9 = uVar10 - local_28e8;
      if (uVar10 < local_28e8 || uVar9 == 0) {
        paVar3->_M_elems[0] = (uchar)uVar10;
        uVar9 = 1;
      }
      else {
        *(byte *)((long)paVar3 + (uVar9 - 1)) = bVar11;
      }
      uVar4 = local_28f0 + uVar10;
      uVar5 = local_28f8;
      if (uVar4 <= local_28f8) {
        paVar3->_M_elems[uVar4 + 1] = bVar11;
        uVar5 = uVar4;
      }
      for (; uVar9 <= uVar5; uVar9 = uVar9 + 1) {
        local_2901 = bVar11;
        if ((((1 < uVar10) && (1 < uVar9)) && (pcVar7[uVar10 - 1] == local_2900[uVar9 - 2])) &&
           (pcVar7[uVar10 - 2] == local_2900[uVar9 - 1])) {
          local_2901 = ((array<unsigned_char,_102UL> *)paVar6->_M_elems)->_M_elems[uVar9 - 0x68] + 1
          ;
        }
        local_2904 = ((array<unsigned_char,_102UL> *)paVar6->_M_elems)->_M_elems[uVar9] + '\x01';
        local_2903 = ((array<unsigned_char,_102UL> *)paVar6->_M_elems)->_M_elems[uVar9 + 0x65] +
                     '\x01';
        local_2902 = (pcVar7[uVar10 - 1] != local_2900[uVar9 - 1]) +
                     ((array<unsigned_char,_102UL> *)paVar6->_M_elems)->_M_elems[uVar9 - 1];
        __l._M_len = 5;
        __l._M_array = &local_2905;
        local_2905 = bVar11;
        uVar2 = std::min<unsigned_char>(__l);
        paVar6[1]._M_elems[uVar9] = uVar2;
      }
      paVar6 = paVar6 + 1;
    }
    bVar12 = d._M_elems[local_28e0]._M_elems[local_28f8];
  }
  return bVar12;
}

Assistant:

uint8_t CappedDamerauLevenshteinDistance(absl::string_view s1,
                                         absl::string_view s2, uint8_t cutoff) {
  const uint8_t MAX_SIZE = 100;
  const uint8_t _cutoff = std::min(MAX_SIZE, cutoff);
  const uint8_t cutoff_plus_1 = static_cast<uint8_t>(_cutoff + 1);

  if (s1.size() > s2.size()) std::swap(s1, s2);
  if (s1.size() + _cutoff < s2.size() || s2.size() > MAX_SIZE)
    return cutoff_plus_1;

  if (s1.empty())
    return static_cast<uint8_t>(s2.size());

  // Lower diagonal bound: y = x - lower_diag
  const uint8_t lower_diag =
      _cutoff - static_cast<uint8_t>(s2.size() - s1.size());
  // Upper diagonal bound: y = x + upper_diag
  const uint8_t upper_diag = _cutoff;

  // d[i][j] is the number of edits required to convert s1[0, i] to s2[0, j]
  std::array<std::array<uint8_t, MAX_SIZE + 2>, MAX_SIZE + 2> d;
  std::iota(d[0].begin(), d[0].begin() + upper_diag + 1, 0);
  d[0][cutoff_plus_1] = cutoff_plus_1;
  for (size_t i = 1; i <= s1.size(); ++i) {
    // Deduce begin of relevant window.
    size_t j_begin = 1;
    if (i > lower_diag) {
      j_begin = i - lower_diag;
      d[i][j_begin - 1] = cutoff_plus_1;
    } else {
      d[i][0] = static_cast<uint8_t>(i);
    }

    // Deduce end of relevant window.
    size_t j_end = i + upper_diag;
    if (j_end > s2.size()) {
      j_end = s2.size();
    } else {
      d[i][j_end + 1] = cutoff_plus_1;
    }

    for (size_t j = j_begin; j <= j_end; ++j) {
      const uint8_t deletion_distance = d[i - 1][j] + 1;
      const uint8_t insertion_distance = d[i][j - 1] + 1;
      const uint8_t mismatched_tail_cost = s1[i - 1] == s2[j - 1] ? 0 : 1;
      const uint8_t mismatch_distance = d[i - 1][j - 1] + mismatched_tail_cost;
      uint8_t transposition_distance = _cutoff + 1;
      if (i > 1 && j > 1 && s1[i - 1] == s2[j - 2] && s1[i - 2] == s2[j - 1])
        transposition_distance = d[i - 2][j - 2] + 1;
      d[i][j] = std::min({cutoff_plus_1, deletion_distance, insertion_distance,
                          mismatch_distance, transposition_distance});
    }
  }
  return d[s1.size()][s2.size()];
}